

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.cpp
# Opt level: O0

BumpAllocator * __thiscall slang::BumpAllocator::operator=(BumpAllocator *this,BumpAllocator *other)

{
  BumpAllocator *other_local;
  BumpAllocator *this_local;
  
  if (this != other) {
    ~BumpAllocator(this);
    BumpAllocator(this,other);
  }
  return this;
}

Assistant:

BumpAllocator& BumpAllocator::operator=(BumpAllocator&& other) noexcept {
    if (this != &other) {
        this->~BumpAllocator();
        new (this) BumpAllocator(std::move(other));
    }
    return *this;
}